

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void __thiscall
CVmObjBigNum::encode_ber(CVmObjBigNum *this,char *buf,size_t buflen,size_t *outlen,int *ov)

{
  char cVar1;
  ushort uVar2;
  size_t sVar3;
  CVmBigNumCacheReg *pCVar4;
  CVmBigNumCache *pCVar5;
  uint *puVar6;
  ushort *dst;
  long lVar7;
  long lVar8;
  uint16_t tmp;
  bool bVar9;
  uint thdl;
  ulong rem;
  uint local_44;
  uint *local_40;
  char local_38 [8];
  
  *ov = (byte)(this->super_CVmObject).ext_[4] & 1;
  *outlen = 0;
  uVar2 = *(ushort *)(this->super_CVmObject).ext_;
  local_40 = (uint *)ov;
  dst = (ushort *)CVmBigNumCache::alloc_reg(S_bignum_cache,(ulong)(uVar2 + 1 >> 1) + 5,&local_44);
  if (dst != (ushort *)0x0) {
    *dst = uVar2;
    *(undefined1 *)(dst + 2) = 0;
  }
  copy_val((char *)dst,(this->super_CVmObject).ext_,0);
  puVar6 = local_40;
  bVar9 = (dst[2] & 8) == 0;
  if ((bVar9) && (*outlen < buflen)) {
    do {
      div_by_long((char *)dst,0x80,(unsigned_long *)local_38);
      sVar3 = *outlen;
      *outlen = sVar3 + 1;
      buf[sVar3] = local_38[0];
      bVar9 = (dst[2] & 8) == 0;
      if (!bVar9) break;
    } while (*outlen < buflen);
  }
  pCVar5 = S_bignum_cache;
  pCVar4 = S_bignum_cache->reg_;
  pCVar4[local_44].nxt_ = S_bignum_cache->free_reg_;
  pCVar5->free_reg_ = pCVar4 + local_44;
  *puVar6 = *puVar6 | (uint)bVar9;
  if (*outlen == 0) {
    *outlen = 1;
    *buf = '\0';
  }
  if (1 < (int)(uint)*outlen) {
    lVar8 = 0;
    lVar7 = (ulong)((uint)*outlen & 0x7fffffff) - 2;
    do {
      cVar1 = buf[lVar8];
      buf[lVar8] = buf[lVar7 + 1];
      buf[lVar7 + 1] = cVar1;
      lVar8 = lVar8 + 1;
      bVar9 = lVar8 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar9);
  }
  if (1 < (int)*outlen) {
    lVar7 = 0;
    do {
      buf[lVar7] = buf[lVar7] | 0x80;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)*outlen + -1);
  }
  return;
}

Assistant:

void CVmObjBigNum::encode_ber(char *buf, size_t buflen, size_t &outlen,
                              int &ov)
{
    /* BER can only store unsigned integers */
    ov = get_neg(ext_);

    /* clear the output buffer */
    outlen = 0;

    /* make a temporary copy of the value in a temp register */
    uint thdl;
    char *tmp = alloc_temp_reg(get_prec(ext_), &thdl);
    copy_val(tmp, ext_, FALSE);

    /* keep going until the number is zero or we run out of space */
    int z;
    while (!(z = is_zero(tmp)) && outlen < buflen)
    {
        /* get the low-order 7 bits by getting the remainder mod 128 */
        ulong rem;
        div_by_long(tmp, 128, &rem);
        
        /* store it */
        buf[outlen++] = (char)rem;
    }

    /* release the temporary register */
    release_temp_reg(thdl);

    /* if we ran out of buffer before we ran out of digits, we overflowed */
    ov |= (!z);

    /* if we wrote nothing, write a trivial zero value */
    if (outlen == 0)
        buf[outlen++] = 0;

    /* 
     *   We stored the bytes from least significant to most significant, but
     *   the standard format is the other way around.  Reverse the bytes.  
     */
    int i, j;
    for (i = 0, j = (int)outlen - 1 ; i < j ; ++i, --j)
    {
        char tmpc = buf[i];
        buf[i] = buf[j];
        buf[j] = tmpc;
    }

    /* set the high bit in every byte except the last one */
    for (i = 0 ; i < (int)outlen - 1 ; ++i)
        buf[i] |= 0x80;
}